

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

Error __thiscall
llvm::handleErrorImpl<llvm::DWARFContext::dumpWarning(llvm::Error)::__0>
          (llvm *this,
          unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload,
          anon_class_1_0_00000001 *Handler)

{
  anon_class_1_0_00000001 *H;
  bool bVar1;
  type E;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_40 [3];
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_28;
  anon_class_1_0_00000001 *local_20;
  anon_class_1_0_00000001 *Handler_local;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload_local;
  
  local_20 = Handler;
  Handler_local = (anon_class_1_0_00000001 *)Payload;
  Payload_local = (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)this
  ;
  E = std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::operator*
                (Payload);
  bVar1 = ErrorHandlerTraits<void_(&)(llvm::ErrorInfoBase_&)>::appliesTo(E);
  H = local_20;
  if (bVar1) {
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::unique_ptr
              (&local_28,Payload);
    ErrorHandlerTraits<void(&)(llvm::ErrorInfoBase&)>::
    apply<llvm::DWARFContext::dumpWarning(llvm::Error)::__0>
              ((ErrorHandlerTraits<void(&)(llvm::ErrorInfoBase&)> *)this,H,&local_28);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (&local_28);
  }
  else {
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::unique_ptr
              (local_40,Payload);
    handleErrorImpl(this,local_40);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (local_40);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error handleErrorImpl(std::unique_ptr<ErrorInfoBase> Payload,
                      HandlerT &&Handler, HandlerTs &&... Handlers) {
  if (ErrorHandlerTraits<HandlerT>::appliesTo(*Payload))
    return ErrorHandlerTraits<HandlerT>::apply(std::forward<HandlerT>(Handler),
                                               std::move(Payload));
  return handleErrorImpl(std::move(Payload),
                         std::forward<HandlerTs>(Handlers)...);
}